

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas_test.hpp
# Opt level: O0

int lucasTest(int n)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int *__last;
  int *__first;
  result_type __s;
  size_type sVar4;
  reference pvVar5;
  int iVar6;
  int iStack_b4;
  undefined8 uStack_b0;
  int aiStack_a8 [4];
  ulong local_98;
  int local_8c;
  int *local_88;
  int *local_80;
  vector<int,_std::allocator<int>_> *local_78;
  int local_6c;
  byte local_65;
  int k;
  int iStack_60;
  bool flag;
  int local_5c;
  int a;
  int i_1;
  int local_4c;
  ulong uStack_48;
  int i;
  unsigned_long __vla_expr0;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> factors;
  int n_local;
  
  if (n == 1) {
    factors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = -1;
  }
  else if (n == 2) {
    factors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 1;
  }
  else if (n % 2 == 0) {
    factors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0;
  }
  else {
    local_78 = (vector<int,_std::allocator<int>_> *)local_28;
    uStack_b0 = 0x10b22b;
    factors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = n;
    std::vector<int,_std::allocator<int>_>::vector(local_78);
    uStack_b0 = 0x10b239;
    primeFactors((int)factors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + -1,local_78);
    lVar2 = -((ulong)((int)factors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage - 3) * 4 + 0xf &
             0xfffffffffffffff0);
    for (local_4c = 0;
        local_4c <
        (int)factors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage + -2; local_4c = local_4c + 1) {
      ((int *)((long)aiStack_a8 + lVar2))[local_4c] = local_4c + 2;
    }
    local_88 = (int *)((long)&iStack_b4 +
                      (long)(int)factors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage * 4 + lVar2);
    local_80 = (int *)((long)aiStack_a8 + lVar2);
    uStack_48 = (ulong)((int)factors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage - 3);
    __vla_expr0 = (unsigned_long)aiStack_a8;
    *(undefined8 *)((long)aiStack_a8 + lVar2 + -8) = 0x10b2c9;
    __s = time((time_t *)0x0);
    *(undefined8 *)((long)aiStack_a8 + lVar2 + -8) = 0x10b2d5;
    std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
    linear_congruential_engine
              ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&a,__s);
    __first = local_80;
    __last = local_88;
    *(undefined8 *)((long)aiStack_a8 + lVar2 + -8) = 0x10b2e8;
    std::shuffle<int*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
              (__first,__last,
               (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&a);
    for (local_5c = 0;
        iVar3 = (int)factors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
        local_5c <
        (int)factors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage + -2; local_5c = local_5c + 1) {
      iVar1 = local_80[local_5c];
      iVar6 = (int)factors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + -1;
      iStack_60 = iVar1;
      *(undefined8 *)((long)aiStack_a8 + lVar2 + -8) = 0x10b31f;
      local_8c = power(iVar1,iVar6,iVar3);
      if (local_8c != 1) {
        factors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = 0;
        goto LAB_0010b40f;
      }
      local_65 = 1;
      local_6c = 0;
      while( true ) {
        local_98 = (ulong)local_6c;
        *(undefined8 *)((long)aiStack_a8 + lVar2 + -8) = 0x10b364;
        sVar4 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)local_28);
        if (sVar4 <= local_98) break;
        aiStack_a8[1] = iStack_60;
        aiStack_a8[2] =
             (int)factors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + -1;
        sVar4 = (size_type)local_6c;
        *(undefined8 *)((long)aiStack_a8 + lVar2 + -8) = 0x10b394;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_28,sVar4);
        iVar1 = (int)factors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
        iVar3 = aiStack_a8[1];
        iVar6 = aiStack_a8[2] / *pvVar5;
        *(undefined8 *)((long)aiStack_a8 + lVar2 + -8) = 0x10b3b2;
        aiStack_a8[3] = power(iVar3,iVar6,iVar1);
        if (aiStack_a8[3] == 1) {
          local_65 = 0;
          break;
        }
        local_6c = local_6c + 1;
      }
      if ((local_65 & 1) != 0) {
        factors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = 1;
        goto LAB_0010b40f;
      }
    }
    factors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = -1;
LAB_0010b40f:
    k = 1;
    *(undefined8 *)(__vla_expr0 - 8) = 0x10b41f;
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  }
  return factors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
}

Assistant:

inline int lucasTest(int n)
{
    // Base cases
    if (n == 1)
        return -1;
    if (n == 2)
        return 1; // Prime 
    if (n % 2 == 0)
        return 0; // Composite 

    // Generating and storing factors
    // of n-1
    std::vector<int> factors;
    primeFactors(n - 1, factors);
 
    // Array for random generator. This array
    // is to ensure one number is generated
    // only once
    int random[n - 3];
    for (int i = 0; i < n - 2; i++)
        random[i] = i + 2;
         
    // shuffle random array to produce randomness
    std::shuffle(random, random + n - 3, std::default_random_engine(time(0)));
 
    // Now one by one perform Lucas Primality
    // Test on random numbers generated.
    for (int i = 0; i < n - 2; ++i) {
        int a = random[i];
        if (power(a, n - 1, n) != 1)
            return 0; // composite
 
        // this is to check if every factor
        // of n-1 satisfy the condition
        bool flag = true;
        for (int k = 0; k < factors.size(); k++) {
            // if a^((n-1)/q) equal 1
            if (power(a, (n - 1) / factors[k], n) == 1) {
                flag = false;
                break;
            }
        }
 
        // if all condition satisfy
        if (flag)
            return 1; // prime
    }
    return -1; // probably composite
}